

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  SubstituteArg *this;
  bool bVar1;
  int iVar2;
  LogMessage *this_00;
  char *__src;
  char *in_RSI;
  SubstituteArg *src;
  uint index_1;
  int i_1;
  char *target;
  int original_size;
  int index;
  int i;
  int size;
  SubstituteArg *args_array [11];
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  LogMessage *in_stack_fffffffffffffd50;
  LogLevel_conflict in_stack_fffffffffffffd5c;
  LogMessage *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffddc;
  LogMessage *in_stack_fffffffffffffde0;
  int local_1b4;
  char *local_1b0;
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [95];
  allocator local_121;
  string local_120 [32];
  string local_100 [108];
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88 [10];
  undefined8 local_38;
  char *local_10;
  
  local_38 = 0;
  local_8c = 0;
  local_90 = 0;
  local_10 = in_RSI;
  do {
    if (local_10[local_90] == '\0') {
      if (local_8c != 0) {
        iVar2 = std::__cxx11::string::size();
        STLStringResizeUninitialized
                  ((string *)in_stack_fffffffffffffd50,
                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        local_1b0 = string_as_array((string *)in_stack_fffffffffffffd50);
        local_1b0 = local_1b0 + iVar2;
        for (local_1b4 = 0; local_10[local_1b4] != '\0'; local_1b4 = local_1b4 + 1) {
          if (local_10[local_1b4] == '$') {
            bVar1 = ascii_isdigit(local_10[local_1b4 + 1]);
            if (bVar1) {
              this = (SubstituteArg *)local_88[(int)local_10[local_1b4 + 1] - 0x30];
              __src = internal::SubstituteArg::data(this);
              iVar2 = internal::SubstituteArg::size(this);
              memcpy(local_1b0,__src,(long)iVar2);
              iVar2 = internal::SubstituteArg::size(this);
              local_1b4 = local_1b4 + 1;
              local_1b0 = local_1b0 + iVar2;
            }
            else if (local_10[local_1b4 + 1] == '$') {
              *local_1b0 = '$';
              local_1b4 = local_1b4 + 1;
              local_1b0 = local_1b0 + 1;
            }
          }
          else {
            *local_1b0 = local_10[local_1b4];
            local_1b0 = local_1b0 + 1;
          }
        }
      }
      return;
    }
    if (local_10[local_90] == '$') {
      bVar1 = ascii_isdigit(local_10[local_90 + 1]);
      if (bVar1) {
        local_94 = local_10[local_90 + 1] + -0x30;
        iVar2 = internal::SubstituteArg::size((SubstituteArg *)local_88[local_94]);
        if (iVar2 == -1) {
          protobuf::internal::LogMessage::LogMessage
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                     (char *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffd50,
                     (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          this_00 = protobuf::internal::LogMessage::operator<<
                              (in_stack_fffffffffffffd50,
                               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                              );
          iVar2 = CountSubstituteArgs((SubstituteArg **)in_stack_fffffffffffffd50);
          protobuf::internal::LogMessage::operator<<(this_00,iVar2);
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffd50,
                     (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_120,local_10,&local_121);
          CEscape(in_stack_fffffffffffffd78);
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffd50,
                     (string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffd50,
                     (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffd50,
                     (LogMessage *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          std::__cxx11::string::~string(local_100);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x55cf28);
          return;
        }
        iVar2 = internal::SubstituteArg::size((SubstituteArg *)local_88[local_94]);
        local_8c = iVar2 + local_8c;
      }
      else {
        if (local_10[local_90 + 1] != '$') {
          protobuf::internal::LogMessage::LogMessage
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                     (char *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffd50,
                     (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a0,local_10,&local_1a1);
          CEscape(in_stack_fffffffffffffd78);
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffd50,
                     (string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          protobuf::internal::LogMessage::operator<<
                    (in_stack_fffffffffffffd50,
                     (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffd50,
                     (LogMessage *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          std::__cxx11::string::~string(local_180);
          std::__cxx11::string::~string(local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x55d13d);
          return;
        }
        local_8c = local_8c + 1;
      }
      local_90 = local_90 + 1;
    }
    else {
      local_8c = local_8c + 1;
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, nullptr
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}